

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslerror.cpp
# Opt level: O3

size_t qHash(QSslError *key,size_t seed)

{
  _Head_base<0UL,_QSslErrorPrivate_*,_false> _Var1;
  size_t sVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  QSslCertificate local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  _Var1._M_head_impl =
       (key->d)._M_t.super___uniq_ptr_impl<QSslErrorPrivate,_std::default_delete<QSslErrorPrivate>_>
       ._M_t.super__Tuple_impl<0UL,_QSslErrorPrivate_*,_std::default_delete<QSslErrorPrivate>_>.
       super__Head_base<0UL,_QSslErrorPrivate_*,_false>._M_head_impl;
  uVar3 = (ulong)(_Var1._M_head_impl)->error;
  QSslCertificate::QSslCertificate(&local_30,&(_Var1._M_head_impl)->certificate);
  sVar2 = qHash(&local_30,0);
  QSslCertificate::~QSslCertificate(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    uVar3 = (uVar3 >> 0x20 ^ uVar3) * -0x2917014799a6026d;
    uVar3 = (uVar3 >> 0x20 ^ uVar3) * -0x2917014799a6026d;
    uVar3 = (seed >> 2) + seed * 0x40 + 0x9e3779b9 + (uVar3 >> 0x20 ^ uVar3) ^ seed;
    return (uVar3 >> 2) + 0x9e3779b9 + sVar2 + uVar3 * 0x40 ^ uVar3;
  }
  __stack_chk_fail();
}

Assistant:

size_t qHash(const QSslError &key, size_t seed) noexcept
{
    QtPrivate::QHashCombine hash;
    seed = hash(seed, key.error());
    seed = hash(seed, key.certificate());
    return seed;
}